

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

void __thiscall
CMU462::StaticScene::BVHAccel::BVHAccel
          (BVHAccel *this,
          vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          *_primitives,size_t max_leaf_size)

{
  ulong uVar1;
  size_type sVar2;
  reference ppPVar3;
  BVHNode *this_00;
  BBox local_110;
  BBox local_c8;
  ulong local_80;
  size_t i;
  BBox bb;
  size_t max_leaf_size_local;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *_primitives_local;
  BVHAccel *this_local;
  
  Aggregate::Aggregate(&this->super_Aggregate);
  (this->super_Aggregate).super_Primitive._vptr_Primitive = (_func_int **)&PTR_get_bbox_00394e40;
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  operator=(&(this->super_Aggregate).primitives,_primitives);
  BBox::BBox((BBox *)&i);
  local_80 = 0;
  while( true ) {
    uVar1 = local_80;
    sVar2 = std::
            vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
            ::size(&(this->super_Aggregate).primitives);
    if (sVar2 <= uVar1) break;
    ppPVar3 = std::
              vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
              ::operator[](&(this->super_Aggregate).primitives,local_80);
    (**(*ppPVar3)->_vptr_Primitive)(&local_c8);
    BBox::expand((BBox *)&i,&local_c8);
    local_80 = local_80 + 1;
  }
  this_00 = (BVHNode *)operator_new(0x68);
  BBox::BBox(&local_110,(BBox *)&i);
  sVar2 = std::
          vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          ::size(&(this->super_Aggregate).primitives);
  BVHNode::BVHNode(this_00,&local_110,0,sVar2);
  this->root = this_00;
  return;
}

Assistant:

BVHAccel::BVHAccel(const std::vector<Primitive *> &_primitives,
      size_t max_leaf_size) {

    this->primitives = _primitives;

    // TODO:
    // Construct a BVH from the given vector of primitives and maximum leaf
    // size configuration. The starter code build a BVH aggregate with a
    // single leaf node (which is also the root) that encloses all the
    // primitives.

    BBox bb;
    for (size_t i = 0; i < primitives.size(); ++i) {
      bb.expand(primitives[i]->get_bbox());
    }

    root = new BVHNode(bb, 0, primitives.size());

  }